

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::VectorVarTest_DISABLED_Speed_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::VectorVarTest_DISABLED_Speed_Test> *this)

{
  VectorVarTest *this_00;
  
  WithParamInterface<std::tuple<int,int(*)(short_const*,short_const*,int),int(*)(short_const*,short_const*,int)>>
  ::parameter_ = &this->parameter_;
  this_00 = (VectorVarTest *)operator_new(0x48);
  anon_unknown.dwarf_171beb8::VectorVarTest::VectorVarTest(this_00);
  (this_00->super_VectorVarTestBase).super_Test._vptr_Test =
       (_func_int **)&PTR__VectorVarTest_00f45620;
  (this_00->
  super_WithParamInterface<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>
  )._vptr_WithParamInterface = (_func_int **)&DAT_00f45660;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }